

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int match_idents(dmr_C *C,token *token,...)

{
  char *pcVar1;
  bool bVar2;
  bool local_112;
  long *local_110;
  long local_f8 [24];
  ident *next;
  va_list args;
  token *token_local;
  dmr_C *C_local;
  
  if ((SUB84(token->pos,0) & 0x3f) == 2) {
    args[0]._0_8_ = &stack0x00000008;
    next._0_4_ = 0x10;
    do {
      if ((uint)next < 0x29) {
        local_110 = (long *)((long)local_f8 + (long)(int)(uint)next);
        next._0_4_ = (uint)next + 8;
      }
      else {
        local_110 = (long *)args[0]._0_8_;
        args[0]._0_8_ = args[0]._0_8_ + 8;
      }
      pcVar1 = (char *)*local_110;
      bVar2 = false;
      if (pcVar1 != (char *)0x0) {
        bVar2 = (token->field_2).number != pcVar1;
      }
    } while (bVar2);
    local_112 = false;
    if (pcVar1 != (char *)0x0) {
      local_112 = (token->field_2).number == pcVar1;
    }
    C_local._4_4_ = (uint)local_112;
  }
  else {
    C_local._4_4_ = 0;
  }
  return C_local._4_4_;
}

Assistant:

static int SENTINEL_ATTR match_idents(struct dmr_C *C, struct token *token, ...)
{
	va_list args;
	struct ident * next;
        
        (void) C;

	if (dmrC_token_type(token) != TOKEN_IDENT)
		return 0;

	va_start(args, token);
	do {
		next = va_arg(args, struct ident *);
	} while (next && token->ident != next);
	va_end(args);

	return next && token->ident == next;
}